

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSDDOMParser::endAnnotationElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,bool complete)

{
  XMLBuffer *this_00;
  XMLSize_t XVar1;
  XMLSize_t XVar2;
  DOMDocumentImpl *pDVar3;
  DOMNode *pDVar4;
  int iVar5;
  XMLCh *pXVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  
  this_00 = &this->fAnnotationBuf;
  XVar1 = (this->fAnnotationBuf).fIndex;
  XVar2 = (this->fAnnotationBuf).fCapacity;
  if ((int)CONCAT71(in_register_00000011,complete) == 0) {
    if (XVar1 == XVar2) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar2 = (this->fAnnotationBuf).fIndex;
    XVar1 = XVar2 + 1;
    (this->fAnnotationBuf).fIndex = XVar1;
    (this->fAnnotationBuf).fBuffer[XVar2] = L'<';
    if (XVar1 == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar1 = (this->fAnnotationBuf).fIndex;
    (this->fAnnotationBuf).fIndex = XVar1 + 1;
    (this->fAnnotationBuf).fBuffer[XVar1] = L'/';
    pXVar6 = QName::getRawName(elemDecl->fElementName);
    XMLBuffer::append(this_00,pXVar6);
    if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar1 = (this->fAnnotationBuf).fIndex;
    (this->fAnnotationBuf).fIndex = XVar1 + 1;
    (this->fAnnotationBuf).fBuffer[XVar1] = L'>';
  }
  else {
    if (XVar1 == XVar2) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar2 = (this->fAnnotationBuf).fIndex;
    XVar1 = XVar2 + 1;
    (this->fAnnotationBuf).fIndex = XVar1;
    (this->fAnnotationBuf).fBuffer[XVar2] = L'\n';
    if (XVar1 == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar2 = (this->fAnnotationBuf).fIndex;
    XVar1 = XVar2 + 1;
    (this->fAnnotationBuf).fIndex = XVar1;
    (this->fAnnotationBuf).fBuffer[XVar2] = L'<';
    if (XVar1 == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar1 = (this->fAnnotationBuf).fIndex;
    (this->fAnnotationBuf).fIndex = XVar1 + 1;
    (this->fAnnotationBuf).fBuffer[XVar1] = L'/';
    pXVar6 = QName::getRawName(elemDecl->fElementName);
    XMLBuffer::append(this_00,pXVar6);
    if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar1 = (this->fAnnotationBuf).fIndex;
    pXVar6 = (this->fAnnotationBuf).fBuffer;
    (this->fAnnotationBuf).fIndex = XVar1 + 1;
    pXVar6[XVar1] = L'>';
    pDVar3 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
    pXVar6[XVar1 + 1] = L'\0';
    iVar5 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3e])();
    pDVar4 = (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode;
    (*pDVar4->_vptr_DOMNode[0x11])(pDVar4,CONCAT44(extraout_var,iVar5));
    (this->fAnnotationBuf).fIndex = 0;
  }
  return;
}

Assistant:

void XSDDOMParser::endAnnotationElement( const XMLElementDecl& elemDecl
                                       , bool complete)
{
    if (complete)
    {
        fAnnotationBuf.append(chLF);
        fAnnotationBuf.append(chOpenAngle);
        fAnnotationBuf.append(chForwardSlash);
        fAnnotationBuf.append(elemDecl.getFullName());
        fAnnotationBuf.append(chCloseAngle);

        // note that this is always called after endElement on <annotation>'s
        // child and before endElement on annotation.
        // hence, we must make this the child of the current
        // parent's only child.
        DOMTextImpl *node = (DOMTextImpl *)fDocument->createTextNode(fAnnotationBuf.getRawBuffer());
        fCurrentNode->appendChild(node);
        fAnnotationBuf.reset();
    }
    else      //capturing character calls
    {
        fAnnotationBuf.append(chOpenAngle);
        fAnnotationBuf.append(chForwardSlash);
        fAnnotationBuf.append(elemDecl.getFullName());
        fAnnotationBuf.append(chCloseAngle);
    }
}